

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O3

void __thiscall jrtplib::RTCPCompoundPacketBuilder::Report::~Report(Report *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject = (_func_int **)&PTR__Report_0013c8a0;
  Clear(this);
  p_Var2 = (this->reportblocks).
           super__List_base<jrtplib::RTCPCompoundPacketBuilder::Buffer,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::Buffer>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->reportblocks) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

~Report() { Clear(); }